

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_align.c
# Opt level: O0

int32 align_destroy_sent_hmm(void)

{
  pnode_t *local_10;
  pnode_t *p;
  
  destroy_state_dag();
  for (local_10 = pnode_list; local_10 != (pnode_t *)0x0; local_10 = local_10->alloc_next) {
    plinks_free(local_10->succlist);
    plinks_free(local_10->predlist);
  }
  pnodes_free();
  plinks_free(phead.succlist);
  plinks_free(ptail.predlist);
  return 0;
}

Assistant:

int32
align_destroy_sent_hmm(void)
{
    pnode_t *p;

    destroy_state_dag();

    for (p = pnode_list; p; p = p->alloc_next) {
        plinks_free(p->succlist);
        plinks_free(p->predlist);
    }
    pnodes_free();

    plinks_free(phead.succlist);
    plinks_free(ptail.predlist);

    return 0;
}